

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_frontend.cpp
# Opt level: O1

uint32_t __thiscall
basisu::basisu_frontend::refine_block_endpoints_given_selectors(basisu_frontend *this)

{
  uint32_t *puVar1;
  anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1 *paVar2;
  byte bVar3;
  vec2U *pvVar4;
  uint *puVar5;
  endpoint_cluster_etc_params *peVar6;
  anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1 *paVar7;
  EVP_PKEY_CTX *pEVar8;
  etc_block *peVar9;
  byte bVar10;
  uint16_t uVar11;
  uint uVar12;
  anon_union_4_2_6eba8969_for_color_rgba_0 aVar13;
  long lVar14;
  byte bVar15;
  sbyte sVar16;
  ushort packed_color5;
  uint uVar17;
  anon_union_4_2_6eba8969_for_color_rgba_0 aVar18;
  pixel_block *ppVar19;
  pixel_block *ppVar20;
  char *pcVar21;
  int iVar22;
  anon_union_4_2_6eba8969_for_color_rgba_0 aVar23;
  anon_union_4_2_6eba8969_for_color_rgba_0 aVar24;
  long lVar25;
  uint uVar26;
  ulong uVar27;
  anon_union_4_2_6eba8969_for_color_rgba_0 aVar28;
  EVP_PKEY_CTX *in_RSI;
  int iVar29;
  anon_union_4_2_6eba8969_for_color_rgba_0 aVar30;
  int iVar31;
  anon_union_4_2_6eba8969_for_color_rgba_0 aVar32;
  ulong uVar33;
  elemental_vector *peVar34;
  endpoint_cluster_etc_params *peVar35;
  long lVar36;
  int iVar37;
  elemental_vector *this_00;
  ulong *puVar38;
  bool bVar39;
  float fVar40;
  bool results_valid [2];
  color_rgba colors [2];
  uint32_t new_size;
  uint32_t b [2];
  uint32_t g [2];
  results cluster_optimizer_results [2];
  uint8_vec subblock_selectors [2];
  vector<basisu::color_rgba> subblock_colors [2];
  vector<unsigned_char> cluster_selectors [2];
  uint64_t cur_subblock_err [2];
  color_rgba unpacked_block_pixels [16];
  char local_31e [2];
  uint local_31c;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_318;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_314;
  undefined8 local_310;
  ulong local_308;
  uint local_2fc;
  etc_block *local_2f8;
  endpoint_cluster_etc_params *local_2f0;
  pixel_block *local_2e8;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_2e0 [2];
  basisu_frontend *local_2d8;
  int local_2cc;
  undefined8 local_2c8;
  long local_2c0;
  undefined8 uStack_2b8;
  undefined1 local_2b0;
  undefined4 *local_2a8;
  undefined8 local_2a0;
  undefined2 local_298;
  undefined8 local_290;
  ulong local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  uint64_t uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  ulong local_238;
  etc_block *local_230;
  elemental_vector local_228;
  void *local_218 [2];
  elemental_vector local_208;
  void *local_1f8 [2];
  elemental_vector local_1e8;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  ulong local_1c8 [2];
  undefined1 local_1b8 [4];
  anon_union_4_2_6eba8969_for_color_rgba_0 aStack_1b4;
  results *prStack_1b0;
  unsigned_short *local_188;
  undefined8 uStack_180;
  uint *local_178;
  undefined8 uStack_170;
  uint *local_168;
  undefined8 uStack_160;
  uint32_t *local_158;
  uint32_t *puStack_150;
  uchar *local_148;
  undefined8 uStack_140;
  uchar *puStack_138;
  undefined1 uStack_130;
  undefined7 local_12f;
  undefined1 auStack_128 [16];
  uchar *local_118;
  undefined8 uStack_110;
  uint64_t local_108;
  bool local_100;
  etc1_solution_coordinates local_f8;
  uchar *local_e8;
  undefined8 uStack_e0;
  uint64_t local_d8;
  bool local_d0;
  uchar *local_c8;
  undefined8 uStack_c0;
  
  debug_printf("refine_block_endpoints_given_selectors\n");
  if (0 < (int)this->m_total_blocks) {
    iVar37 = 1;
    uVar33 = 0;
    do {
      if ((this->m_block_endpoint_clusters_indices).m_size <= uVar33) {
        pcVar21 = "T &basisu::vector<basisu::vec2U>::operator[](size_t) [T = basisu::vec2U]";
        goto LAB_002377cc;
      }
      pvVar4 = (this->m_block_endpoint_clusters_indices).m_p;
      uVar26 = pvVar4[uVar33].m_comps[0];
      if ((this->m_endpoint_cluster_etc_params).m_size <= uVar26) {
LAB_002378a2:
        pcVar21 = 
        "T &basisu::vector<basisu::basisu_frontend::endpoint_cluster_etc_params>::operator[](size_t) [T = basisu::basisu_frontend::endpoint_cluster_etc_params]"
        ;
        goto LAB_002377cc;
      }
      peVar35 = (this->m_endpoint_cluster_etc_params).m_p;
      _local_1b8 = (params *)CONCAT44(aStack_1b4,iVar37 + -1);
      puVar5 = peVar35[uVar26].m_subblocks.m_p;
      uVar17 = peVar35[uVar26].m_subblocks.m_size;
      if (local_1b8 < puVar5 + uVar17 && (puVar5 <= local_1b8 && puVar5 != (uint *)0x0)) {
LAB_002378bc:
        pcVar21 = "void basisu::vector<unsigned int>::push_back(const T &) [T = unsigned int]";
LAB_00237840:
        __assert_fail("!m_p || (&obj < m_p) || (&obj >= (m_p + m_size))",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                      ,0x267,pcVar21);
      }
      if (peVar35[uVar26].m_subblocks.m_capacity <= uVar17) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&peVar35[uVar26].m_subblocks,uVar17 + 1,true,4,
                   (object_mover)0x0,false);
      }
      *(undefined1 (*) [4])(peVar35[uVar26].m_subblocks.m_p + peVar35[uVar26].m_subblocks.m_size) =
           local_1b8;
      puVar1 = &peVar35[uVar26].m_subblocks.m_size;
      *puVar1 = *puVar1 + 1;
      uVar26 = pvVar4[uVar33].m_comps[1];
      if ((this->m_endpoint_cluster_etc_params).m_size <= uVar26) goto LAB_002378a2;
      peVar35 = (this->m_endpoint_cluster_etc_params).m_p;
      _local_1b8 = (params *)CONCAT44(aStack_1b4,iVar37);
      puVar5 = peVar35[uVar26].m_subblocks.m_p;
      uVar17 = peVar35[uVar26].m_subblocks.m_size;
      in_RSI = (EVP_PKEY_CTX *)(ulong)uVar17;
      if (local_1b8 < puVar5 + (long)in_RSI && (puVar5 <= local_1b8 && puVar5 != (uint *)0x0))
      goto LAB_002378bc;
      if (peVar35[uVar26].m_subblocks.m_capacity <= uVar17) {
        in_RSI = (EVP_PKEY_CTX *)(ulong)(uVar17 + 1);
        elemental_vector::increase_capacity
                  ((elemental_vector *)&peVar35[uVar26].m_subblocks,uVar17 + 1,true,4,
                   (object_mover)0x0,false);
      }
      *(undefined1 (*) [4])(peVar35[uVar26].m_subblocks.m_p + peVar35[uVar26].m_subblocks.m_size) =
           local_1b8;
      puVar1 = &peVar35[uVar26].m_subblocks.m_size;
      *puVar1 = *puVar1 + 1;
      uVar33 = uVar33 + 1;
      iVar37 = iVar37 + 2;
    } while ((long)uVar33 < (long)(int)this->m_total_blocks);
  }
  if ((this->m_endpoint_cluster_etc_params).m_size == 0) {
    fVar40 = 0.0;
    uVar26 = 0;
  }
  else {
    uVar33 = 0;
    uVar26 = 0;
    local_2fc = 0;
    local_2d8 = this;
    do {
      local_31c = uVar26;
      peVar6 = (this->m_endpoint_cluster_etc_params).m_p;
      local_238 = uVar33;
      peVar35 = peVar6 + uVar33;
      local_1f8[0] = (void *)0x0;
      local_1f8[1] = (void *)0x0;
      local_208.m_p = (void *)0x0;
      local_208.m_size = 0;
      local_208.m_capacity = 0;
      local_218[0] = (void *)0x0;
      local_218[1] = (void *)0x0;
      local_228.m_p = (void *)0x0;
      local_228.m_size = 0;
      local_228.m_capacity = 0;
      local_1c8[0] = 0;
      local_1c8[1] = 0;
      local_2f0 = peVar35;
      if (peVar6[uVar33].m_subblocks.m_size != 0) {
        uVar33 = 0;
        do {
          uVar26 = (peVar35->m_subblocks).m_p[uVar33];
          uVar17 = uVar26 >> 1;
          if ((this->m_encoded_blocks).m_size <= uVar17) goto LAB_002377b7;
          if ((this->m_source_blocks).m_size <= uVar17) {
            __assert_fail("i < m_size",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                          ,0x177,
                          "const T &basisu::vector<basisu::pixel_block>::operator[](size_t) const [T = basisu::pixel_block]"
                         );
          }
          local_230 = (this->m_encoded_blocks).m_p + uVar17;
          bVar10 = (local_230->field_0).m_bytes[3];
          local_2e8 = (this->m_source_blocks).m_p + uVar17;
          unpack_etc1(local_230,(color_rgba *)local_1b8,false);
          this = local_2d8;
          local_2cc = (int)uVar33;
          uVar26 = uVar26 & 1;
          bVar39 = (bVar10 & 2) == 0;
          local_308 = (ulong)bVar39;
          uVar33 = (ulong)bVar39;
          peVar34 = &local_208 + uVar33;
          this_00 = &local_228 + uVar33;
          local_310 = (ulong)(uVar26 << 5) + 0x322450;
          local_2f8 = (etc_block *)(&DAT_003223f1 + (uVar26 << 4));
          lVar36 = 0;
          do {
            uVar27 = (ulong)*(uint *)(local_310 + lVar36 * 4);
            paVar2 = (anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1 *)
                     (local_2e8->m_pixels[0] + uVar27);
            paVar7 = (anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1 *)
                     peVar34->m_p;
            uVar26 = *(uint *)(local_1f8 + uVar33 * 2 + -1);
            if (((paVar7 != (anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1
                             *)0x0) && (paVar7 <= paVar2)) && (paVar2 < paVar7 + uVar26)) {
              pcVar21 = 
              "void basisu::vector<basisu::color_rgba>::push_back(const T &) [T = basisu::color_rgba]"
              ;
              goto LAB_00237840;
            }
            if (*(uint *)((long)local_1f8 + uVar33 * 0x10 + -4) <= uVar26) {
              elemental_vector::increase_capacity(peVar34,uVar26 + 1,true,4,(object_mover)0x0,false)
              ;
            }
            peVar35 = local_2f0;
            ((anon_union_4_2_6eba8969_for_color_rgba_0 *)
            ((long)peVar34->m_p + (ulong)*(uint *)(local_1f8 + uVar33 * 2 + -1) * 4))->field_1 =
                 *paVar2;
            *(int *)(local_1f8 + uVar33 * 2 + -1) = *(int *)(local_1f8 + uVar33 * 2 + -1) + 1;
            if ((this->m_params).m_perceptual == true) {
              iVar37 = (uint)paVar2->r - (uint)(byte)local_1b8[uVar27 * 4];
              iVar22 = (uint)paVar2->b - (uint)(byte)local_1b8[uVar27 * 4 + 2];
              iVar29 = iVar22 * 9 + iVar37 * 0x1b +
                       ((uint)paVar2->g - (uint)(byte)local_1b8[uVar27 * 4 + 1]) * 0x5c;
              lVar14 = (long)(iVar37 * 0x80 - iVar29);
              lVar25 = (long)(iVar22 * 0x80 - iVar29);
              uVar26 = ((uint)((int)((ulong)(lVar25 * lVar25) >> 7) * 3) >> 7) +
                       (int)((ulong)((long)iVar29 * (long)iVar29) >> 7) +
                       ((uint)((int)((ulong)(lVar14 * lVar14) >> 7) * 0x1a) >> 7);
            }
            else {
              iVar22 = (uint)paVar2->g - (uint)(byte)local_1b8[uVar27 * 4 + 1];
              iVar29 = (uint)paVar2->b - (uint)(byte)local_1b8[uVar27 * 4 + 2];
              iVar37 = (uint)paVar2->r - (uint)(byte)local_1b8[uVar27 * 4];
              uVar26 = iVar29 * iVar29 + iVar22 * iVar22 + iVar37 * iVar37;
            }
            local_1c8[local_308] = local_1c8[local_308] + (ulong)uVar26;
            bVar10 = *(byte *)((long)local_2f8 + lVar36 * 2 + -1);
            bVar15 = *(byte *)((long)&local_2f8->field_0 + lVar36 * 2);
            if (3 < (bVar15 | bVar10)) {
              __assert_fail("(x | y) < 4",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_etc.h"
                            ,0xe3,
                            "uint32_t basisu::etc_block::get_raw_selector(uint32_t, uint32_t) const"
                           );
            }
            uVar26 = (uint)bVar15 + (bVar10 & 1) * 4;
            local_288 = CONCAT71(local_288._1_7_,
                                 *(undefined1 *)
                                  ((long)&g_etc1_to_selector_index +
                                  (ulong)((uint)((*(byte *)((long)local_230 +
                                                           (7 - (ulong)(bVar10 >> 1))) >>
                                                  (uVar26 & 0x1f) & 1) != 0) +
                                         (*(byte *)((long)local_230 + (5 - (ulong)(bVar10 >> 1))) >>
                                          ((byte)uVar26 & 0x1f) & 1) * 2)));
            pEVar8 = (EVP_PKEY_CTX *)this_00->m_p;
            uVar26 = *(uint *)(local_218 + uVar33 * 2 + -1);
            in_RSI = (EVP_PKEY_CTX *)(ulong)uVar26;
            if ((EVP_PKEY_CTX *)&local_288 < pEVar8 + (long)in_RSI &&
                (pEVar8 <= (EVP_PKEY_CTX *)&local_288 && pEVar8 != (EVP_PKEY_CTX *)0x0)) {
              pcVar21 = 
              "void basisu::vector<unsigned char>::push_back(const T &) [T = unsigned char]";
              goto LAB_00237840;
            }
            if (*(uint *)((long)local_218 + uVar33 * 0x10 + -4) <= uVar26) {
              in_RSI = (EVP_PKEY_CTX *)(ulong)(uVar26 + 1);
              elemental_vector::increase_capacity(this_00,uVar26 + 1,true,1,(object_mover)0x0,false)
              ;
            }
            *(EVP_PKEY_CTX *)((long)this_00->m_p + (ulong)*(uint *)(local_218 + uVar33 * 2 + -1)) =
                 local_288._0_1_;
            *(int *)(local_218 + uVar33 * 2 + -1) = *(int *)(local_218 + uVar33 * 2 + -1) + 1;
            lVar36 = lVar36 + 1;
          } while (lVar36 != 8);
          uVar33 = (ulong)(local_2cc + 1U);
        } while (local_2cc + 1U < (peVar35->m_subblocks).m_size);
      }
      local_31e[0] = '\0';
      local_31e[1] = '\0';
      local_288 = 0;
      uStack_280 = 0;
      local_278 = 0;
      uStack_270 = 0;
      local_268 = 0;
      uStack_260 = 0;
      local_258 = 0;
      uStack_250 = 0;
      local_248 = 0;
      uStack_240 = 0;
      local_1d8 = 0;
      uStack_1d0 = 0;
      local_1e8.m_p = (void *)0x0;
      local_1e8.m_size = 0;
      local_1e8.m_capacity = 0;
      puVar38 = &local_288;
      lVar36 = 0;
      lVar14 = 0;
      do {
        uVar26 = *(uint *)((long)local_1f8 + lVar36 + -8);
        if (uVar26 != 0) {
          local_118 = (uchar *)0x0;
          uStack_110._0_4_ = 0;
          uStack_110._4_4_ = 0;
          local_168 = (uint *)0x0;
          uStack_160._0_4_ = 0;
          uStack_160._4_4_ = 0;
          local_178 = (uint *)0x0;
          uStack_170._0_4_ = 0;
          uStack_170._4_4_ = 0;
          local_188 = (unsigned_short *)0x0;
          uStack_180._0_4_ = 0;
          uStack_180._4_4_ = 0;
          auStack_128[0] = '\0';
          auStack_128._1_8_ = 0;
          puStack_138 = (uchar *)0x0;
          uStack_130 = 0;
          local_12f = 0;
          local_148 = (uchar *)0x0;
          uStack_140._0_4_ = 0;
          uStack_140._4_4_ = 0;
          local_108 = 0xffffffffffffffff;
          local_100 = false;
          local_f8.m_color4 = false;
          local_f8.m_unscaled_color.field_0 = (anon_union_4_2_6eba8969_for_color_rgba_0)0x0;
          local_f8.m_inten_table = 0;
          local_e8 = (uchar *)0x0;
          uStack_e0._0_4_ = 0;
          uStack_e0._4_4_ = 0;
          local_d8 = 0xffffffffffffffff;
          local_d0 = false;
          local_c8 = (uchar *)0x0;
          uStack_c0._0_4_ = 0;
          uStack_c0._4_4_ = 0;
          _local_1b8 = (params *)0x0;
          prStack_1b0 = (results *)0x0;
          local_158 = (uint32_t *)0x0;
          puStack_150 = (uint32_t *)0x0;
          local_2c8 = 0x100010100000002;
          local_2b0 = 0;
          uStack_2b8 = 0;
          local_2a8 = &etc1_optimizer::params::clear_optimizer_params()::s_default_scan_delta;
          local_2a0 = 1;
          local_298 = 0x100;
          local_290 = 0;
          local_2c0 = (ulong)uVar26 << 0x20;
          uStack_2b8 = *(undefined8 *)((long)&local_208.m_p + lVar36);
          local_2b0 = (char)lVar14;
          local_2c8 = CONCAT35(0x10001,CONCAT14((this->m_params).m_perceptual,2));
          if (*(int *)((long)local_218 + lVar36 + -8) != 0) {
            local_290 = *(undefined8 *)((long)&local_228.m_p + lVar36);
            local_2c8 = CONCAT44(local_2c8._4_4_,3);
            peVar34 = (elemental_vector *)((long)&local_1e8.m_p + lVar36);
            uVar17 = *(uint *)((long)&local_1e8.m_size + lVar36);
            if (uVar17 != uVar26) {
              if (uVar17 <= uVar26) {
                if (*(uint *)((long)&local_1e8.m_capacity + lVar36) < uVar26) {
                  elemental_vector::increase_capacity
                            (peVar34,uVar26,uVar17 + 1 == uVar26,1,(object_mover)0x0,false);
                }
                uVar17 = *(uint *)((long)&local_1e8.m_size + lVar36);
                memset((void *)((ulong)uVar17 + (long)peVar34->m_p),0,(ulong)(uVar26 - uVar17));
              }
              *(uint *)((long)&local_1e8.m_size + lVar36) = uVar26;
            }
            *(uint *)(puVar38 + 2) = uVar26;
            if (*(int *)((long)&local_1e8.m_size + lVar36) != 0) {
              puVar38[3] = (ulong)peVar34->m_p;
              in_RSI = (EVP_PKEY_CTX *)&local_2c8;
              etc1_optimizer::init((etc1_optimizer *)local_1b8,in_RSI);
              bVar39 = etc1_optimizer::compute((etc1_optimizer *)local_1b8);
              if ((bVar39) && (*puVar38 < local_1c8[lVar14])) {
                local_31e[lVar14] = '\x01';
              }
              local_2fc = local_2fc + (uVar26 >> 3);
              etc1_optimizer::~etc1_optimizer((etc1_optimizer *)local_1b8);
              peVar35 = local_2f0;
              goto LAB_002372b4;
            }
          }
          pcVar21 = "T &basisu::vector<unsigned char>::operator[](size_t) [T = unsigned char]";
          goto LAB_002377cc;
        }
LAB_002372b4:
        lVar14 = lVar14 + 1;
        lVar36 = lVar36 + 0x10;
        puVar38 = puVar38 + 5;
      } while (lVar36 == 0x10);
      ppVar19 = (pixel_block *)0x0;
      uVar26 = local_31c;
      do {
        ppVar20 = ppVar19;
        if (local_31e[(long)ppVar19] == '\x01') {
          in_RSI = (EVP_PKEY_CTX *)CONCAT71((int7)((ulong)in_RSI >> 8),1);
          local_308 = 0;
          local_2e8 = ppVar19;
          do {
            local_310 = CONCAT44(local_310._4_4_,(int)in_RSI);
            if ((peVar35->m_subblocks).m_size != 0) {
              lVar36 = 0;
              do {
                uVar17 = (peVar35->m_subblocks).m_p[lVar36];
                uVar12 = uVar17 >> 1;
                if ((this->m_encoded_blocks).m_size <= uVar12) goto LAB_002377b7;
                peVar9 = (this->m_encoded_blocks).m_p;
                iVar37 = 0x19;
                if (local_2e8 ==
                    (pixel_block *)(ulong)((peVar9[uVar12].field_0.m_bytes[3] & 2) == 0)) {
                  uVar17 = uVar17 & 1;
                  peVar9 = peVar9 + uVar12;
                  if (local_2e8 == (pixel_block *)0x0) {
                    bVar10 = (peVar9->field_0).m_bytes[0];
                    bVar15 = (peVar9->field_0).m_bytes[1];
                    bVar3 = (peVar9->field_0).m_bytes[2];
                    packed_color5 =
                         (bVar10 & 0xf8) << 7 | (ushort)(bVar3 >> 3) + (bVar15 & 0xfff8) * 4;
                    local_31c = uVar26;
                    local_2f8 = peVar9;
                    etc_block::unpack_color5
                              ((uint32_t *)local_1b8,(uint32_t *)&local_2c8,
                               (uint32_t *)local_2e0[0].m_comps,packed_color5,false);
                    bVar39 = etc_block::unpack_color5
                                       ((uint32_t *)(local_1b8 + 4),
                                        (uint32_t *)((long)&local_2c8 + 4),
                                        (uint32_t *)local_2e0[1].m_comps,packed_color5,
                                        (bVar3 & 7) + (bVar15 & 7) * 8 | (bVar10 & 7) << 6,false,
                                        0xff);
                    peVar35 = local_2f0;
                    uVar26 = local_31c;
                    if (!bVar39) {
                      __assert_fail("success",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_frontend.cpp"
                                    ,0xb72,
                                    "uint32_t basisu::basisu_frontend::refine_block_endpoints_given_selectors()"
                                   );
                    }
                    uVar33 = (ulong)(uVar17 << 2);
                    *(uint *)(local_1b8 + uVar33) = (uint)(byte)uStack_280;
                    *(uint *)((long)&local_2c8 + uVar33) = (uint)uStack_280._1_1_;
                    *(uint *)((long)local_2e0 + uVar33) = (uint)uStack_280._2_1_;
                    this = local_2d8;
                    aVar23 = (anon_union_4_2_6eba8969_for_color_rgba_0)local_1b8;
                    if (0xfe < (int)local_1b8) {
                      aVar23 = (anon_union_4_2_6eba8969_for_color_rgba_0)0xff;
                    }
                    aVar24 = (anon_union_4_2_6eba8969_for_color_rgba_0)0x0;
                    if ((int)aVar23 < 1) {
                      aVar23 = aVar24;
                    }
                    local_318.m_comps[0] = aVar23.m_comps[0];
                    aVar28 = local_2c8._0_4_;
                    if (0xfe < (int)local_2c8._0_4_) {
                      aVar28 = (anon_union_4_2_6eba8969_for_color_rgba_0)0xff;
                    }
                    if ((int)aVar28 < 1) {
                      aVar28 = aVar24;
                    }
                    aVar32 = local_2e0[0];
                    if (0xfe < (int)local_2e0[0]) {
                      aVar32 = (anon_union_4_2_6eba8969_for_color_rgba_0)0xff;
                    }
                    local_318.m_comps[1] = aVar28.m_comps[0];
                    if ((int)aVar32 < 1) {
                      aVar32 = (anon_union_4_2_6eba8969_for_color_rgba_0)0x0;
                    }
                    aVar13 = aStack_1b4;
                    if (0xfe < (int)aStack_1b4) {
                      aVar13 = (anon_union_4_2_6eba8969_for_color_rgba_0)0xff;
                    }
                    local_318.m_comps[2] = aVar32.m_comps[0];
                    if ((int)aVar13 < 1) {
                      aVar13 = aVar24;
                    }
                    local_318.m_comps[3] = 0xff;
                    aVar18 = local_2c8._4_4_;
                    if (0xfe < (int)local_2c8._4_4_) {
                      aVar18 = (anon_union_4_2_6eba8969_for_color_rgba_0)0xff;
                    }
                    local_314.m_comps[0] = aVar13.m_comps[0];
                    if ((int)aVar18 < 1) {
                      aVar18 = aVar24;
                    }
                    local_314.m_comps[1] = aVar18.m_comps[0];
                    aVar30 = local_2e0[1];
                    if (0xfe < (int)local_2e0[1]) {
                      aVar30 = (anon_union_4_2_6eba8969_for_color_rgba_0)0xff;
                    }
                    if ((int)aVar30 < 1) {
                      aVar30 = aVar24;
                    }
                    local_314.m_comps[2] = aVar30.m_comps[0];
                    local_314.m_comps[3] = 0xff;
                    iVar29 = (int)aVar13 - (int)aVar23;
                    iVar22 = (int)aVar18 - (int)aVar28;
                    iVar31 = (int)aVar30 - (int)aVar32;
                    iVar37 = iVar22;
                    if (iVar29 < iVar22) {
                      iVar37 = iVar29;
                    }
                    if (iVar31 <= iVar37) {
                      iVar37 = iVar31;
                    }
                    if (iVar37 < -4) {
                      local_310 = (ulong)local_310._4_4_ << 0x20;
                      iVar37 = 0x17;
                    }
                    else {
                      if (iVar22 < iVar29) {
                        iVar22 = iVar29;
                      }
                      if (iVar22 <= iVar31) {
                        iVar22 = iVar31;
                      }
                      iVar37 = 0;
                      if (3 < iVar22) {
                        iVar37 = 0x17;
                      }
                      uVar12 = (uint)local_310 & 0xff;
                      if (3 < iVar22) {
                        uVar12 = 0;
                      }
                      if (iVar22 < 4 && (int)local_308 == 1) {
                        iVar37 = 0;
                        if ((local_310 & 1) != 0) {
                          etc_block::set_block_color5
                                    (local_2f8,(color_rgba *)&local_318.field_1,
                                     (color_rgba *)&local_314.field_1);
                          if (7 < uStack_280._4_4_) goto LAB_002377d6;
                          sVar16 = (uVar17 == 0) * '\x03' + 2;
                          (local_2f8->field_0).m_bytes[3] =
                               (byte)(uStack_280._4_4_ << sVar16) |
                               ~(byte)(7 << sVar16) & (local_2f8->field_0).m_bytes[3];
                          peVar35->m_color_error[0] = local_288;
                          peVar35->m_inten_table[0] = uStack_280._4_4_;
                          peVar35->m_color_unscaled[0].field_0 = uStack_280._0_4_;
                          uVar26 = uVar26 + 1;
                          iVar37 = 0;
                        }
                      }
                      else {
                        local_310 = CONCAT44(local_310._4_4_,uVar12);
                      }
                    }
                  }
                  else {
                    uVar11 = etc_block::pack_color4((color_rgba *)&local_258,false,0x7f);
                    bVar10 = (byte)uVar11;
                    if (uVar17 == 0) {
                      bVar15 = (peVar9->field_0).m_bytes[1];
                      (peVar9->field_0).m_bytes[0] =
                           (byte)(uVar11 >> 4) & 0xf0 | (peVar9->field_0).m_bytes[0] & 0xf;
                      (peVar9->field_0).m_bytes[1] = bVar10 & 0xf0 | bVar15 & 0xf;
                      bVar15 = (peVar9->field_0).m_bytes[2] & 0xf;
                      bVar10 = bVar10 << 4;
                    }
                    else {
                      bVar15 = (peVar9->field_0).m_bytes[1];
                      (peVar9->field_0).m_bytes[0] =
                           (byte)(uVar11 >> 8) & 0xf | (peVar9->field_0).m_bytes[0] & 0xf0;
                      (peVar9->field_0).m_bytes[1] = (byte)(uVar11 >> 4) & 0xf | bVar15 & 0xf0;
                      bVar15 = (peVar9->field_0).m_bytes[2] & 0xf0;
                      bVar10 = bVar10 & 0xf;
                    }
                    (peVar9->field_0).m_bytes[2] = bVar10 | bVar15;
                    if (7 < local_258._4_4_) {
LAB_002377d6:
                      __assert_fail("t < 8",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_etc.h"
                                    ,0xc1,
                                    "void basisu::etc_block::set_inten_table(uint32_t, uint32_t)");
                    }
                    sVar16 = (uVar17 == 0) * '\x03' + 2;
                    (peVar9->field_0).m_bytes[3] =
                         (byte)(local_258._4_4_ << sVar16) |
                         ~(byte)(7 << sVar16) & (peVar9->field_0).m_bytes[3];
                    peVar35->m_color_error[1] = uStack_260;
                    peVar35->m_inten_table[1] = local_258._4_4_;
                    peVar35->m_color_unscaled[1].field_0 = local_258._0_4_;
                    uVar26 = uVar26 + 1;
                    iVar37 = 0;
                  }
                }
              } while (((iVar37 == 0x19) || (iVar37 == 0)) &&
                      (lVar36 = lVar36 + 1, (uint)lVar36 < (peVar35->m_subblocks).m_size));
            }
            in_RSI = (EVP_PKEY_CTX *)(local_310 & 0xffffffff);
            ppVar20 = local_2e8;
          } while ((local_2e8 == (pixel_block *)0x0) &&
                  (iVar37 = (int)local_308, local_308 = (ulong)(iVar37 + 1), iVar37 == 0));
        }
        ppVar19 = (pixel_block *)((long)&ppVar20->m_pixels[0][0].field_0 + 1);
      } while (ppVar20 == (pixel_block *)0x0);
      lVar36 = 0x20;
      do {
        if (*(void **)((long)local_1f8 + lVar36) != (void *)0x0) {
          free(*(void **)((long)local_1f8 + lVar36));
        }
        lVar36 = lVar36 + -0x10;
      } while (lVar36 != 0);
      lVar36 = 0x20;
      do {
        if (*(void **)((long)&local_238 + lVar36) != (void *)0x0) {
          free(*(void **)((long)&local_238 + lVar36));
        }
        lVar36 = lVar36 + -0x10;
      } while (lVar36 != 0);
      lVar36 = 0x20;
      do {
        if (*(void **)((long)local_218 + lVar36) != (void *)0x0) {
          free(*(void **)((long)local_218 + lVar36));
        }
        lVar36 = lVar36 + -0x10;
      } while (lVar36 != 0);
      uVar33 = local_238 + 1;
    } while (uVar33 < (this->m_endpoint_cluster_etc_params).m_size);
    fVar40 = (float)local_2fc;
  }
  if ((this->m_params).m_debug_stats != false) {
    debug_printf("Total subblock endpoints refined: %u (%3.1f%%)\n",
                 SUB84((double)(((float)uVar26 * 100.0) / fVar40),0),(ulong)uVar26);
  }
  return uVar26;
LAB_002377b7:
  pcVar21 = "T &basisu::vector<basisu::etc_block>::operator[](size_t) [T = basisu::etc_block]";
LAB_002377cc:
  __assert_fail("i < m_size",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                ,0x178,pcVar21);
}

Assistant:

uint32_t basisu_frontend::refine_block_endpoints_given_selectors()
	{
		debug_printf("refine_block_endpoints_given_selectors\n");
				
		for (int block_index = 0; block_index < static_cast<int>(m_total_blocks); block_index++)
		{
			//uint32_t selector_cluster = m_block_selector_cluster_index(block_x, block_y);
			vec2U &endpoint_clusters = m_block_endpoint_clusters_indices[block_index];

			m_endpoint_cluster_etc_params[endpoint_clusters[0]].m_subblocks.push_back(block_index * 2);

			m_endpoint_cluster_etc_params[endpoint_clusters[1]].m_subblocks.push_back(block_index * 2 + 1);
		}

		uint32_t total_subblocks_refined = 0;
		uint32_t total_subblocks_examined = 0;

		for (uint32_t endpoint_cluster_index = 0; endpoint_cluster_index < m_endpoint_cluster_etc_params.size(); endpoint_cluster_index++)
		{
			endpoint_cluster_etc_params &subblock_params = m_endpoint_cluster_etc_params[endpoint_cluster_index];

			const uint_vec &subblocks = subblock_params.m_subblocks;
			//uint32_t total_pixels = subblock.m_subblocks.size() * 8;

			basisu::vector<color_rgba> subblock_colors[2]; // [use_individual_mode]
			uint8_vec subblock_selectors[2];

			uint64_t cur_subblock_err[2] = { 0, 0 };

			for (uint32_t subblock_iter = 0; subblock_iter < subblocks.size(); subblock_iter++)
			{
				uint32_t training_vector_index = subblocks[subblock_iter];

				uint32_t block_index = training_vector_index >> 1;
				uint32_t subblock_index = training_vector_index & 1;
				const bool is_flipped = true;

				const etc_block &blk = m_encoded_blocks[block_index];

				const bool use_individual_mode = !blk.get_diff_bit();

				const color_rgba *pSource_block_pixels = get_source_pixel_block(block_index).get_ptr();

				color_rgba unpacked_block_pixels[16];
				unpack_etc1(blk, unpacked_block_pixels);

				for (uint32_t i = 0; i < 8; i++)
				{
					const uint32_t pixel_index = g_etc1_pixel_indices[is_flipped][subblock_index][i];
					const etc_coord2 &coords = g_etc1_pixel_coords[is_flipped][subblock_index][i];

					subblock_colors[use_individual_mode].push_back(pSource_block_pixels[pixel_index]);

					cur_subblock_err[use_individual_mode] += color_distance(m_params.m_perceptual, pSource_block_pixels[pixel_index], unpacked_block_pixels[pixel_index], false);

					subblock_selectors[use_individual_mode].push_back(static_cast<uint8_t>(blk.get_selector(coords.m_x, coords.m_y)));
				}
			} // subblock_iter

			etc1_optimizer::results cluster_optimizer_results[2];
			bool results_valid[2] = { false, false };

			clear_obj(cluster_optimizer_results);

			basisu::vector<uint8_t> cluster_selectors[2];

			for (uint32_t use_individual_mode = 0; use_individual_mode < 2; use_individual_mode++)
			{
				const uint32_t total_pixels = (uint32_t)subblock_colors[use_individual_mode].size();

				if (!total_pixels)
					continue;

				total_subblocks_examined += total_pixels / 8;

				etc1_optimizer optimizer;
				etc1_solution_coordinates solutions[2];

				etc1_optimizer::params cluster_optimizer_params;
				cluster_optimizer_params.m_num_src_pixels = total_pixels;
				cluster_optimizer_params.m_pSrc_pixels = &subblock_colors[use_individual_mode][0];

				cluster_optimizer_params.m_use_color4 = use_individual_mode != 0;
				cluster_optimizer_params.m_perceptual = m_params.m_perceptual;

				cluster_optimizer_params.m_pForce_selectors = &subblock_selectors[use_individual_mode][0];
				cluster_optimizer_params.m_quality = cETCQualityUber;

				cluster_selectors[use_individual_mode].resize(total_pixels);

				cluster_optimizer_results[use_individual_mode].m_n = total_pixels;
				cluster_optimizer_results[use_individual_mode].m_pSelectors = &cluster_selectors[use_individual_mode][0];

				optimizer.init(cluster_optimizer_params, cluster_optimizer_results[use_individual_mode]);

				if (!optimizer.compute())
					continue;

				if (cluster_optimizer_results[use_individual_mode].m_error < cur_subblock_err[use_individual_mode])
					results_valid[use_individual_mode] = true;

			} // use_individual_mode

			for (uint32_t use_individual_mode = 0; use_individual_mode < 2; use_individual_mode++)
			{
				if (!results_valid[use_individual_mode])
					continue;

				uint32_t num_passes = use_individual_mode ? 1 : 2;

				bool all_passed5 = true;

				for (uint32_t pass = 0; pass < num_passes; pass++)
				{
					for (uint32_t subblock_iter = 0; subblock_iter < subblocks.size(); subblock_iter++)
					{
						const uint32_t training_vector_index = subblocks[subblock_iter];

						const uint32_t block_index = training_vector_index >> 1;
						const uint32_t subblock_index = training_vector_index & 1;
						//const bool is_flipped = true;

						etc_block &blk = m_encoded_blocks[block_index];

						if (!blk.get_diff_bit() != static_cast<bool>(use_individual_mode != 0))
							continue;

						if (use_individual_mode)
						{
							blk.set_base4_color(subblock_index, etc_block::pack_color4(cluster_optimizer_results[1].m_block_color_unscaled, false));
							blk.set_inten_table(subblock_index, cluster_optimizer_results[1].m_block_inten_table);

							subblock_params.m_color_error[1] = cluster_optimizer_results[1].m_error;
							subblock_params.m_inten_table[1] = cluster_optimizer_results[1].m_block_inten_table;
							subblock_params.m_color_unscaled[1] = cluster_optimizer_results[1].m_block_color_unscaled;

							total_subblocks_refined++;
						}
						else
						{
							const uint16_t base_color5 = blk.get_base5_color();
							const uint16_t delta_color3 = blk.get_delta3_color();

							uint32_t r[2], g[2], b[2];
							etc_block::unpack_color5(r[0], g[0], b[0], base_color5, false);
							bool success = etc_block::unpack_color5(r[1], g[1], b[1], base_color5, delta_color3, false);
							assert(success);
							BASISU_NOTE_UNUSED(success);

							r[subblock_index] = cluster_optimizer_results[0].m_block_color_unscaled.r;
							g[subblock_index] = cluster_optimizer_results[0].m_block_color_unscaled.g;
							b[subblock_index] = cluster_optimizer_results[0].m_block_color_unscaled.b;

							color_rgba colors[2] = { color_rgba(r[0], g[0], b[0], 255), color_rgba(r[1], g[1], b[1], 255) };

							if (!etc_block::try_pack_color5_delta3(colors))
							{
								all_passed5 = false;
								break;
							}

							if ((pass == 1) && (all_passed5))
							{
								blk.set_block_color5(colors[0], colors[1]);
								blk.set_inten_table(subblock_index, cluster_optimizer_results[0].m_block_inten_table);

								subblock_params.m_color_error[0] = cluster_optimizer_results[0].m_error;
								subblock_params.m_inten_table[0] = cluster_optimizer_results[0].m_block_inten_table;
								subblock_params.m_color_unscaled[0] = cluster_optimizer_results[0].m_block_color_unscaled;

								total_subblocks_refined++;
							}
						}

					} // subblock_iter

				} // pass

			} // use_individual_mode

		} // endpoint_cluster_index

		if (m_params.m_debug_stats)
			debug_printf("Total subblock endpoints refined: %u (%3.1f%%)\n", total_subblocks_refined, total_subblocks_refined * 100.0f / total_subblocks_examined);
				
		return total_subblocks_refined;
	}